

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

Real __thiscall amrex::MLMG::MLRhsNormInf(MLMG *this,bool local)

{
  long *plVar1;
  longdouble x;
  int iVar2;
  Any *pAVar3;
  double *pdVar4;
  byte in_SIL;
  literals *in_RDI;
  Real t;
  int alev;
  Real r;
  undefined4 uVar5;
  MPI_Comm comm;
  undefined2 uVar6;
  undefined6 in_stack_ffffffffffffffb2;
  double local_28;
  int local_1c;
  double local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  x = (longdouble)0;
  uVar5 = SUB104(x,0);
  comm = (MPI_Comm)((unkuint10)x >> 0x20);
  uVar6 = (undefined2)((unkuint10)x >> 0x40);
  local_18 = literals::operator____rt(in_RDI,x);
  for (local_1c = 0; iVar2 = local_1c, local_1c <= *(int *)(in_RDI + 0x54); local_1c = local_1c + 1)
  {
    plVar1 = *(long **)(in_RDI + 0x48);
    pAVar3 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                        CONCAT62(in_stack_ffffffffffffffb2,uVar6),CONCAT44(comm,uVar5));
    local_28 = (double)(**(code **)(*plVar1 + 0x198))(plVar1,iVar2,pAVar3,1);
    pdVar4 = std::max<double>(&local_18,&local_28);
    local_18 = *pdVar4;
  }
  if ((local_9 & 1) == 0) {
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Max<double>((double *)CONCAT62(in_stack_ffffffffffffffb2,uVar6),comm);
  }
  return local_18;
}

Assistant:

Real
MLMG::MLRhsNormInf (bool local)
{
    BL_PROFILE("MLMG::MLRhsNormInf()");
    Real r = 0.0_rt;
    for (int alev = 0; alev <= finest_amr_lev; ++alev) {
        auto t = linop.AnyNormInfMask(alev, rhs[alev], true);
        r = std::max(r, t);
    }
    if (!local) ParallelAllReduce::Max(r, ParallelContext::CommunicatorSub());
    return r;
}